

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<Fad<double>_>::SolveJacobi
          (TPZMatrix<Fad<double>_> *this,int64_t *numiterations,TPZFMatrix<Fad<double>_> *F,
          TPZFMatrix<Fad<double>_> *result,TPZFMatrix<Fad<double>_> *residual,
          TPZFMatrix<Fad<double>_> *scratch,REAL *tol,int FromCurrent)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  Fad<double> *pFVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double local_e8;
  undefined1 local_a8 [32];
  TPZFMatrix<Fad<double>_> *local_88;
  TPZFMatrix<Fad<double>_> *local_80;
  FadExpr<FadFuncSqrt<Fad<double>_>_> local_78;
  Fad<double> local_50;
  
  local_88 = residual;
  if (FromCurrent == 0) {
    TPZFMatrix<Fad<double>_>::operator=(scratch,F);
    (*(result->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xf])(result);
  }
  else {
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F);
  }
  Dot<Fad<double>>(&local_50,scratch,scratch);
  FadFuncSqrt<Fad<double>_>::FadFuncSqrt((FadFuncSqrt<Fad<double>_> *)local_a8,&local_50);
  FadExpr<FadFuncSqrt<Fad<double>_>_>::FadExpr(&local_78,(FadFuncSqrt<Fad<double>_> *)local_a8);
  Fad<double>::~Fad((Fad<double> *)local_a8);
  if (local_78.fadexpr_.expr_.val_ < 0.0) {
    local_e8 = sqrt(local_78.fadexpr_.expr_.val_);
  }
  else {
    local_e8 = SQRT(local_78.fadexpr_.expr_.val_);
  }
  Fad<double>::~Fad(&local_78.fadexpr_.expr_);
  Fad<double>::~Fad(&local_50);
  iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  if (0 < *numiterations) {
    lVar1 = (F->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
    lVar7 = 0;
    local_80 = F;
    do {
      if (ABS(local_e8) < *tol || ABS(local_e8) == *tol) break;
      if (0 < lVar1) {
        lVar6 = 0;
        local_e8 = 0.0;
        do {
          if (0 < CONCAT44(extraout_var,iVar2)) {
            lVar4 = 0;
            lVar5 = 0;
            do {
              if (((scratch->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar5) ||
                 ((scratch->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol <=
                  (long)local_e8)) {
                TPZFMatrix<Fad<double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              pFVar3 = (Fad<double> *)
                       ((long)&scratch->fElem->val_ +
                       lVar4 + (scratch->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow *
                               lVar6);
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        ((Fad<double> *)&local_78,this,lVar5,lVar5);
              local_a8._0_8_ = pFVar3;
              local_a8._8_8_ = (Fad<double> *)&local_78;
              if (((result->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow <= lVar5) ||
                 ((result->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol <= (long)local_e8
                 )) {
                TPZFMatrix<Fad<double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              Fad<double>::operator+=
                        ((Fad<double> *)
                         ((long)&result->fElem->val_ +
                         lVar4 + (result->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow *
                                 lVar6),
                         (FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *)local_a8);
              Fad<double>::~Fad((Fad<double> *)&local_78);
              lVar5 = lVar5 + 1;
              lVar4 = lVar4 + 0x20;
            } while (CONCAT44(extraout_var,iVar2) != lVar5);
          }
          local_e8 = (double)((long)local_e8 + 1);
          lVar6 = lVar6 + 0x20;
        } while (local_e8 != (double)lVar1);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])
                (this,result,local_80,scratch);
      Dot<Fad<double>>(&local_50,scratch,scratch);
      FadFuncSqrt<Fad<double>_>::FadFuncSqrt((FadFuncSqrt<Fad<double>_> *)local_a8,&local_50);
      FadExpr<FadFuncSqrt<Fad<double>_>_>::FadExpr(&local_78,(FadFuncSqrt<Fad<double>_> *)local_a8);
      Fad<double>::~Fad((Fad<double> *)local_a8);
      if (local_78.fadexpr_.expr_.val_ < 0.0) {
        local_e8 = sqrt(local_78.fadexpr_.expr_.val_);
      }
      else {
        local_e8 = SQRT(local_78.fadexpr_.expr_.val_);
      }
      Fad<double>::~Fad(&local_78.fadexpr_.expr_);
      Fad<double>::~Fad(&local_50);
      lVar7 = lVar7 + 1;
    } while (lVar7 < *numiterations);
  }
  if (local_88 != (TPZFMatrix<Fad<double>_> *)0x0) {
    TPZFMatrix<Fad<double>_>::operator=(local_88,scratch);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveJacobi(int64_t &numiterations,const TPZFMatrix<TVar> &F, TPZFMatrix<TVar> &result,
								  TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch, REAL &tol,const int FromCurrent) {
	
	
	if(FromCurrent) {
		Residual(result,F,scratch);
	} else {
		scratch = F;
		result.Zero();
	}
	REAL res;
	res = TPZExtractVal::val(Norm(scratch));
	int64_t r = Dim();
	int64_t c = F.Cols();
	for(int64_t it=0; it<numiterations && (fabs(res)) > tol; it++) {
		for(int64_t ic=0; ic<c; ic++) {
			for(int64_t i=0; i<r; i++) {
				result(i,ic) += (scratch)(i,ic)/GetVal(i,i);
			}
		}
		Residual(result,F,scratch);
		res = TPZExtractVal::val(Norm(scratch));
	}
	if(residual) *residual = scratch;
}